

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad.c
# Opt level: O0

uint sad(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  int iVar1;
  uint sad;
  int x;
  int y;
  int height_local;
  int width_local;
  int b_stride_local;
  uint8_t *b_local;
  int a_stride_local;
  uint8_t *a_local;
  
  sad = 0;
  b_local = b;
  a_local = a;
  for (y = 0; y < height; y = y + 1) {
    for (x = 0; x < width; x = x + 1) {
      iVar1 = (uint)a_local[x] - (uint)b_local[x];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      sad = iVar1 + sad;
    }
    a_local = a_local + a_stride;
    b_local = b_local + b_stride;
  }
  return sad;
}

Assistant:

static inline unsigned int sad(const uint8_t *a, int a_stride, const uint8_t *b,
                               int b_stride, int width, int height) {
  int y, x;
  unsigned int sad = 0;

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      sad += abs(a[x] - b[x]);
    }

    a += a_stride;
    b += b_stride;
  }
  return sad;
}